

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track-heuristic-partition-matching.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  runtime_error *this;
  value_type_conflict2 vVar2;
  value_type_conflict2 vVar3;
  runtime_error *error;
  SolutionGraph solutionGraph;
  ProblemGraph problemGraph;
  string *in_stack_000001a8;
  SolutionGraph *in_stack_000001b0;
  Solution solution;
  Edge *e;
  iterator __end1;
  iterator __begin1;
  vector<lineage::Edge,_std::allocator<lineage::Edge>_> *__range1;
  NegativeLogProbabilityRatio<double> func;
  Problem problem;
  Parameters parameters;
  string *in_stack_00000418;
  SolutionGraph *in_stack_00000420;
  size_t in_stack_000004c0;
  string *in_stack_000004c8;
  undefined1 in_stack_000004d7;
  double in_stack_000004d8;
  double in_stack_000004e0;
  ProblemGraph *in_stack_000004e8;
  char **in_stack_00000ea0;
  int in_stack_00000eac;
  Solution *in_stack_fffffffffffffc78;
  Parameters *in_stack_fffffffffffffc80;
  value_type_conflict2 in_stack_fffffffffffffc88;
  NegativeLogProbabilityRatio<double> *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  string *in_stack_fffffffffffffca8;
  string local_330 [72];
  Problem *in_stack_fffffffffffffd18;
  ProblemGraph *in_stack_fffffffffffffd20;
  string local_208 [224];
  reference local_128;
  Edge *local_120;
  __normal_iterator<lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
  local_118;
  undefined1 *local_110;
  undefined1 auStack_e0 [16];
  Solution *in_stack_ffffffffffffff30;
  ProblemGraph *in_stack_ffffffffffffff38;
  SolutionGraph *in_stack_ffffffffffffff40;
  string local_60 [64];
  byte local_20;
  int local_4;
  
  local_4 = 0;
  parseCommandLine(in_stack_00000eac,in_stack_00000ea0);
  lineage::loadProblem
            (in_stack_fffffffffffffca8,
             (string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  lineage::NegativeLogProbabilityRatio<double>::NegativeLogProbabilityRatio
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  local_110 = auStack_e0;
  local_118._M_current =
       (Edge *)std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::begin
                         ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)
                          in_stack_fffffffffffffc78);
  local_120 = (Edge *)std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::end
                                ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)
                                 in_stack_fffffffffffffc78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) break;
    local_128 = __gnu_cxx::
                __normal_iterator<lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
                ::operator*(&local_118);
    if (local_128->t0 == local_128->t1) {
      vVar2 = lineage::NegativeLogProbabilityRatio<double>::operator()
                        ((NegativeLogProbabilityRatio<double> *)in_stack_fffffffffffffc80,
                         (value_type_conflict2)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffca8 =
           (string *)
           lineage::NegativeLogProbabilityRatio<double>::operator()
                     ((NegativeLogProbabilityRatio<double> *)in_stack_fffffffffffffc80,
                      (value_type_conflict2)in_stack_fffffffffffffc78);
      local_128->weight = vVar2 + (double)in_stack_fffffffffffffca8;
    }
    else {
      vVar2 = lineage::NegativeLogProbabilityRatio<double>::operator()
                        ((NegativeLogProbabilityRatio<double> *)in_stack_fffffffffffffc80,
                         (value_type_conflict2)in_stack_fffffffffffffc78);
      vVar3 = lineage::NegativeLogProbabilityRatio<double>::operator()
                        ((NegativeLogProbabilityRatio<double> *)in_stack_fffffffffffffc80,
                         (value_type_conflict2)in_stack_fffffffffffffc78);
      local_128->weight = vVar2 + vVar3;
    }
    __gnu_cxx::
    __normal_iterator<lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
    ::operator++(&local_118);
  }
  lineage::Solution::Solution((Solution *)0x184bfc);
  if ((local_20 & 1) != 0) {
    lineage::ProblemGraph::ProblemGraph(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    std::__cxx11::string::string(local_208,local_60);
    lineage::heuristics::
    applyInitializedHeuristic<lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
              (in_stack_000004e8,in_stack_000004e0,in_stack_000004d8,(bool)in_stack_000004d7,
               in_stack_000004c8,in_stack_000004c0);
    lineage::Solution::operator=((Solution *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    lineage::Solution::~Solution((Solution *)0x184cc0);
    std::__cxx11::string::~string(local_208);
    lineage::ProblemGraph::~ProblemGraph((ProblemGraph *)in_stack_fffffffffffffc80);
    lineage::ProblemGraph::ProblemGraph(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    lineage::SolutionGraph::SolutionGraph
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    lineage::SolutionGraph::save(in_stack_00000420,in_stack_00000418);
    std::operator+(in_stack_fffffffffffffca8,(char *)CONCAT17(local_20,in_stack_fffffffffffffca0));
    lineage::SolutionGraph::saveSVG(in_stack_000001b0,in_stack_000001a8);
    std::__cxx11::string::~string(local_330);
    local_4 = 0;
    lineage::SolutionGraph::~SolutionGraph((SolutionGraph *)in_stack_fffffffffffffc80);
    lineage::ProblemGraph::~ProblemGraph((ProblemGraph *)in_stack_fffffffffffffc80);
    lineage::Solution::~Solution((Solution *)0x184e50);
    lineage::Problem::~Problem((Problem *)in_stack_fffffffffffffc80);
    Parameters::~Parameters(in_stack_fffffffffffffc80);
    return local_4;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Disabled bifurcation constraints are not supported.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int
main(int argc, char** argv) try {
    auto parameters = parseCommandLine(argc, argv);

    // load problem:
    auto problem = lineage::loadProblem(parameters.nodesFileName,
                                        parameters.edgesFileName);

    // map edge probabilities to edge cut costs:
    lineage::NegativeLogProbabilityRatio<> func;
    for (auto& e : problem.edges)
        if (e.t0 != e.t1)
            e.weight = func(e.weight) + func(parameters.biasTemporal);
        else
            e.weight = func(e.weight) + func(parameters.biasSpatial);

    // heuristic for initial lineage.
    using Initializer = lineage::heuristics::GreedyLineageAgglomeration<>;

    // global optimizer.
    using BranchingOpt = lineage::heuristics::branching::HungarianBranching<
        lineage::heuristics::PartitionGraph>;

    using LocalBranchingOpt =
        lineage::heuristics::branching::MaskedHungarianBranching<
            lineage::heuristics::PartitionGraph>;
    using HeuristicWithBifurcation =
        lineage::heuristics::LocalPartitionOptimizer<BranchingOpt,
                                                     LocalBranchingOpt>;

    // solve problem
    lineage::Solution solution;
    if (parameters.bifurcationConstraint) {
        solution = lineage::heuristics::applyInitializedHeuristic<
            HeuristicWithBifurcation, Initializer>(
            problem, parameters.terminationCost, parameters.birthCost,
            parameters.bifurcationConstraint, parameters.solutionName,
            parameters.maxDistance);
    } else {
        throw std::runtime_error(
            "Disabled bifurcation constraints are not supported.");
    }

    // save solution:
    lineage::ProblemGraph problemGraph(problem);
    lineage::SolutionGraph solutionGraph(problemGraph, solution);
    solutionGraph.save(parameters.solutionName);
    solutionGraph.saveSVG(parameters.solutionName + "-lineage-tree.svg");

    return 0;
} catch (const std::runtime_error& error) {
    std::cerr << "error: " << error.what() << std::endl;
    return 1;
}